

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSayIntentions.cpp
# Opt level: O0

void __thiscall SayIntentionsConnection::Main(SayIntentionsConnection *this)

{
  anon_class_8_1_8991fb9c __p;
  byte bVar1;
  undefined1 uVar2;
  positionTy *in_RDI;
  exception *e;
  unique_lock<std::mutex> lk;
  positionTy pos;
  ThreadSettings TS;
  mutex_type *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined2 in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff1a;
  byte in_stack_ffffffffffffff1b;
  int in_stack_ffffffffffffff1c;
  ThreadSettings *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff3f;
  positionTy *in_stack_ffffffffffffff40;
  int local_a4;
  duration<long,std::ratio<1l,1l>> local_a0 [20];
  int local_8c;
  duration<long,std::ratio<1l,1l>> local_88 [16];
  undefined1 local_78 [72];
  undefined8 local_30;
  
  ThreadSettings::ThreadSettings
            (in_stack_ffffffffffffff20,
             (char *)CONCAT44(in_stack_ffffffffffffff1c,
                              CONCAT13(in_stack_ffffffffffffff1b,
                                       CONCAT12(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18)
                                      )),in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff08
            );
  while (bVar1 = (**(code **)((long)in_RDI->_lat + 0x20))(), (bVar1 & 1) != 0) {
    local_30 = std::chrono::_V2::steady_clock::now();
    in_RDI[1].mergeCount = (int)local_30;
    in_RDI[1].f = (posFlagsTy)(short)((ulong)local_30 >> 0x20);
    *(short *)&in_RDI[1].field_0x3e = (short)((ulong)local_30 >> 0x30);
    DataRefs::GetViewPos();
    uVar2 = positionTy::isNormal(in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
    if ((bool)uVar2) {
      in_stack_ffffffffffffff28 = DataRefs::GetFdRefreshIntvl(&dataRefs);
      local_8c = in_stack_ffffffffffffff28;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_88,&local_8c);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff20,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT44(in_stack_ffffffffffffff1c,
                          CONCAT13(in_stack_ffffffffffffff1b,
                                   CONCAT12(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))));
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::operator+=((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (duration *)in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff20 = (ThreadSettings *)DataRefs::GetSimTime(&dataRefs);
      in_stack_ffffffffffffff1c = DataRefs::GetFdBufPeriod(&dataRefs);
      *(double *)&in_RDI[6].mergeCount =
           (double)in_stack_ffffffffffffff20 + (double)in_stack_ffffffffffffff1c;
      in_stack_ffffffffffffff1b = (**(code **)((long)in_RDI->_lat + 0x80))(in_RDI,local_78);
      if (((in_stack_ffffffffffffff1b & 1) != 0) &&
         (in_stack_ffffffffffffff1a = (**(code **)((long)in_RDI->_lat + 0x88))(),
         (in_stack_ffffffffffffff1a & 1) != 0)) {
        (**(code **)((long)in_RDI->_lat + 0x48))();
      }
    }
    else {
      local_a4 = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_a0,&local_a4);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff20,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT44(in_stack_ffffffffffffff1c,
                          CONCAT13(in_stack_ffffffffffffff1b,
                                   CONCAT12(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))));
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::operator+=((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (duration *)in_stack_ffffffffffffff08);
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    __p.this._4_2_ = in_stack_ffffffffffffff2c;
    __p.this._0_4_ = in_stack_ffffffffffffff28;
    __p.this._6_1_ = uVar2;
    __p.this._7_1_ = bVar1;
    in_stack_ffffffffffffff40 = in_RDI;
    std::condition_variable::
    wait_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,SayIntentionsConnection::Main()::__0>
              ((condition_variable *)in_stack_ffffffffffffff20,
               (unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff1c,
                        CONCAT13(in_stack_ffffffffffffff1b,
                                 CONCAT12(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),__p);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  ThreadSettings::~ThreadSettings
            ((ThreadSettings *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return;
}

Assistant:

void SayIntentionsConnection::Main ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_SI", LC_ALL_MASK);
    
    while ( shallRun() ) {
        // LiveTraffic Top Level Exception Handling
        try {
            // basis for determining when to be called next
            tNextWakeup = std::chrono::steady_clock::now();
            
            // where are we right now?
            const positionTy pos (dataRefs.GetViewPos());
            
            // If the camera position is valid we can request data around it
            if (pos.isNormal()) {
                // Next wakeup is "refresh interval" from _now_
                tNextWakeup += std::chrono::seconds(dataRefs.GetFdRefreshIntvl());
                
                // fetch data and process it
                tsRequest = dataRefs.GetSimTime() + dataRefs.GetFdBufPeriod();
                if (FetchAllData(pos) && ProcessFetchedData())
                        // reduce error count if processed successfully
                        // as a chance to appear OK in the long run
                        DecErrCnt();
            }
            else {
                // Camera position is yet invalid, retry in a second
                tNextWakeup += std::chrono::seconds(1);
            }
            
            // sleep for FD_REFRESH_INTVL or if woken up for termination
            // by condition variable trigger
            {
                std::unique_lock<std::mutex> lk(FDThreadSynchMutex);
                FDThreadSynchCV.wait_until(lk, tNextWakeup,
                                           [this]{return !shallRun();});
            }
            
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
            IncErrCnt();
        } catch (...) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, "(unknown type)");
            IncErrCnt();
        }
    }
}